

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O1

bool __thiscall trento::MinDistNucleus::is_too_close(MinDistNucleus *this,const_iterator nucleon)

{
  NucleonData *pNVar1;
  NucleonData *pNVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  if (this->dminsq_ < 1e-10) {
    return false;
  }
  pNVar1 = (this->super_Nucleus).nucleons_.
           super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar3 = pNVar1 != nucleon._M_current;
  if (bVar3) {
    dVar6 = (nucleon._M_current)->y_ - pNVar1->y_;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (nucleon._M_current)->x_ - pNVar1->x_;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar6 * dVar6;
    auVar4 = vfmadd231sd_fma(auVar7,auVar4,auVar4);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (nucleon._M_current)->z_ - pNVar1->z_;
    auVar4 = vfmadd231sd_fma(auVar4,auVar9,auVar9);
    dVar6 = auVar4._0_8_;
    while (this->dminsq_ <= dVar6) {
      pNVar2 = pNVar1 + 1;
      bVar3 = pNVar2 != nucleon._M_current;
      if (pNVar2 == nucleon._M_current) {
        return bVar3;
      }
      dVar6 = (nucleon._M_current)->y_ - pNVar1[1].y_;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (nucleon._M_current)->x_ - pNVar2->x_;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = dVar6 * dVar6;
      auVar4 = vfmadd231sd_fma(auVar8,auVar5,auVar5);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = (nucleon._M_current)->z_ - pNVar1[1].z_;
      auVar4 = vfmadd231sd_fma(auVar4,auVar10,auVar10);
      pNVar1 = pNVar2;
      dVar6 = auVar4._0_8_;
    }
  }
  return bVar3;
}

Assistant:

bool MinDistNucleus::is_too_close(const_iterator nucleon) const {
  if (dminsq_ < 1e-10)
    return false;
  for (const_iterator nucleon2 = begin(); nucleon2 != nucleon; ++nucleon2) {
    auto dx = nucleon->x() - nucleon2->x();
    auto dy = nucleon->y() - nucleon2->y();
    auto dz = nucleon->z() - nucleon2->z();
    if (dx*dx + dy*dy + dz*dz < dminsq_)
      return true;
  }
  return false;
}